

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O2

llama_grammar_stack * __thiscall
llama_grammar_parser::c_rules
          (llama_grammar_stack *__return_storage_ptr__,llama_grammar_parser *this)

{
  pointer pvVar1;
  vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *rule;
  pointer pvVar2;
  pointer local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<const_llama_grammar_element_*,_std::allocator<const_llama_grammar_element_*>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llama_grammar_element_*,_std::allocator<const_llama_grammar_element_*>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llama_grammar_element_*,_std::allocator<const_llama_grammar_element_*>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<const_llama_grammar_element_*,_std::allocator<const_llama_grammar_element_*>_>::
  reserve(__return_storage_ptr__,
          ((long)(this->rules).
                 super__Vector_base<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->rules).
                super__Vector_base<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  pvVar1 = (this->rules).
           super__Vector_base<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar2 = (this->rules).
                super__Vector_base<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar2 != pvVar1; pvVar2 = pvVar2 + 1) {
    local_28 = (pvVar2->
               super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>).
               _M_impl.super__Vector_impl_data._M_start;
    std::vector<llama_grammar_element_const*,std::allocator<llama_grammar_element_const*>>::
    emplace_back<llama_grammar_element_const*>
              ((vector<llama_grammar_element_const*,std::allocator<llama_grammar_element_const*>> *)
               __return_storage_ptr__,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

llama_grammar_stack llama_grammar_parser::c_rules() const {
    llama_grammar_stack ret;
    ret.reserve(rules.size());
    for (const auto & rule : rules) {
        ret.push_back(rule.data());
    }
    return ret;
}